

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::handleFatalErrorCondition(RunContext *this,string *message)

{
  string *_stdErr;
  IStreamingReporter *pIVar1;
  SourceLineInfo *in_RDI;
  Totals deltaTotals;
  TestCaseInfo testInfo;
  SectionStats testCaseSectionStats;
  Counts assertions;
  SectionInfo testCaseSection;
  TestCaseInfo *testCaseInfo;
  ResultBuilder resultBuilder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff838;
  ResultBuilder *in_stack_fffffffffffff840;
  ResultBuilder *pRVar2;
  double in_stack_fffffffffffff848;
  allocator *_runInfo;
  Counts *in_stack_fffffffffffff850;
  TestRunStats *this_00;
  RunContext *in_stack_fffffffffffff858;
  RunContext *in_stack_fffffffffffff860;
  TestCaseInfo *in_stack_fffffffffffff878;
  TestCaseStats *in_stack_fffffffffffff880;
  allocator<char> local_721;
  string local_720 [32];
  size_t in_stack_fffffffffffff900;
  size_t in_stack_fffffffffffff908;
  ResultBuilder *in_stack_fffffffffffff910;
  string *in_stack_fffffffffffff918;
  RunContext *in_stack_fffffffffffff920;
  undefined1 local_6d1 [33];
  undefined1 local_6b0 [432];
  undefined8 local_500;
  undefined1 local_3e0 [152];
  Counts local_348 [5];
  TestCaseInfo *local_2c8;
  ResultBuilder local_2b0;
  
  pRVar2 = &local_2b0;
  makeUnexpectedResultBuilder(in_stack_fffffffffffff858);
  ResultBuilder::setResultType(pRVar2,FatalErrorCondition);
  ResultBuilder::operator<<(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  ResultBuilder::captureExpression(in_stack_fffffffffffff910);
  handleUnfinishedSections(in_stack_fffffffffffff860);
  local_2c8 = TestCase::getTestCaseInfo(*(TestCase **)&in_RDI[1].field_0x10);
  SectionInfo::SectionInfo
            ((SectionInfo *)pRVar2,in_RDI,(string *)in_stack_fffffffffffff860,
             (string *)in_stack_fffffffffffff858);
  Counts::Counts(local_348);
  local_348[0].failed = 1;
  SectionStats::SectionStats
            ((SectionStats *)in_stack_fffffffffffff860,(SectionInfo *)in_stack_fffffffffffff858,
             in_stack_fffffffffffff850,in_stack_fffffffffffff848,
             SUB81((ulong)in_stack_fffffffffffff840 >> 0x38,0));
  _stdErr = (string *)
            Ptr<Catch::IStreamingReporter>::operator->
                      ((Ptr<Catch::IStreamingReporter> *)(in_RDI + 8));
  (**(code **)((long)*(IShared *)_stdErr + 0x60))(_stdErr,local_3e0);
  TestCase::getTestCaseInfo(*(TestCase **)&in_RDI[1].field_0x10);
  TestCaseInfo::TestCaseInfo((TestCaseInfo *)in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  Totals::Totals((Totals *)in_stack_fffffffffffff840);
  local_500 = 1;
  pIVar1 = Ptr<Catch::IStreamingReporter>::operator->
                     ((Ptr<Catch::IStreamingReporter> *)(in_RDI + 8));
  this_00 = (TestRunStats *)local_6d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_6d1 + 1),"",(allocator *)this_00);
  _runInfo = (allocator *)&stack0xfffffffffffff907;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffff908,"",_runInfo);
  TestCaseStats::TestCaseStats
            (in_stack_fffffffffffff880,in_stack_fffffffffffff878,(Totals *)pRVar2,&in_RDI->file,
             _stdErr,SUB81((ulong)pIVar1 >> 0x38,0));
  (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar1,local_6b0);
  TestCaseStats::~TestCaseStats((TestCaseStats *)in_stack_fffffffffffff840);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff908);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff907);
  std::__cxx11::string::~string((string *)(local_6d1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_6d1);
  *(long *)&in_RDI[7].field_0x18 = *(long *)&in_RDI[7].field_0x18 + 1;
  pRVar2 = (ResultBuilder *)&local_721;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_720,"",(allocator *)pRVar2);
  testGroupEnded(in_stack_fffffffffffff920,in_stack_fffffffffffff918,
                 (Totals *)in_stack_fffffffffffff910,in_stack_fffffffffffff908,
                 in_stack_fffffffffffff900);
  std::__cxx11::string::~string(local_720);
  std::allocator<char>::~allocator(&local_721);
  pIVar1 = Ptr<Catch::IStreamingReporter>::operator->
                     ((Ptr<Catch::IStreamingReporter> *)(in_RDI + 8));
  TestRunStats::TestRunStats
            (this_00,(TestRunInfo *)_runInfo,(Totals *)pRVar2,SUB81((ulong)pIVar1 >> 0x38,0));
  (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])
            (pIVar1,&stack0xfffffffffffff878);
  TestRunStats::~TestRunStats((TestRunStats *)0x1b3b43);
  TestCaseInfo::~TestCaseInfo((TestCaseInfo *)pRVar2);
  SectionStats::~SectionStats((SectionStats *)0x1b3b5d);
  SectionInfo::~SectionInfo((SectionInfo *)pRVar2);
  ResultBuilder::~ResultBuilder(pRVar2);
  return;
}

Assistant:

virtual void handleFatalErrorCondition( std::string const& message ) {
            ResultBuilder resultBuilder = makeUnexpectedResultBuilder();
            resultBuilder.setResultType( ResultWas::FatalErrorCondition );
            resultBuilder << message;
            resultBuilder.captureExpression();

            handleUnfinishedSections();

            // Recreate section for test case (as we will lose the one that was in scope)
            TestCaseInfo const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
            SectionInfo testCaseSection( testCaseInfo.lineInfo, testCaseInfo.name, testCaseInfo.description );

            Counts assertions;
            assertions.failed = 1;
            SectionStats testCaseSectionStats( testCaseSection, assertions, 0, false );
            m_reporter->sectionEnded( testCaseSectionStats );

            TestCaseInfo testInfo = m_activeTestCase->getTestCaseInfo();

            Totals deltaTotals;
            deltaTotals.testCases.failed = 1;
            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        "",
                                                        "",
                                                        false ) );
            m_totals.testCases.failed++;
            testGroupEnded( "", m_totals, 1, 1 );
            m_reporter->testRunEnded( TestRunStats( m_runInfo, m_totals, false ) );
        }